

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void cppcms_capi_session_delete(cppcms_capi_session *session)

{
  if (session != (cppcms_capi_session *)0x0) {
    cppcms_capi_session::~cppcms_capi_session(session);
    operator_delete(session);
    return;
  }
  return;
}

Assistant:

void cppcms_capi_session_delete(cppcms_capi_session *session)
{
	if(session) delete session;
}